

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O1

bool __thiscall Strategy::isAddrInRange(Strategy *this,Addr addr)

{
  _List_node_base *p_Var1;
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *plVar2;
  bool bVar3;
  
  if ((this->m_config).ranges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size == 0) {
    bVar3 = true;
  }
  else {
    plVar2 = &(this->m_config).ranges;
    for (p_Var1 = (plVar2->
                  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        (bVar3 = p_Var1 != (_List_node_base *)plVar2, bVar3 &&
        ((addr < p_Var1[1]._M_next || (p_Var1[1]._M_prev < addr)))); p_Var1 = p_Var1->_M_next) {
    }
  }
  return bVar3;
}

Assistant:

bool Strategy::isAddrInRange(Addr addr) const {
	// if the range list is empty, consider the address in range.
	if (m_config.ranges.size() == 0)
		return true;

	for (std::list<std::pair<Addr, Addr> >::const_iterator it =  m_config.ranges.cbegin(),
			ed = m_config.ranges.cend(); it != ed; it++) {
		if (addr >= it->first && addr <= it->second)
			return true;
	}

	return false;
}